

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<MiniSTOptions>::insert_simplex<std::initializer_list<short>>
          (Simplex_tree<MiniSTOptions> *this,initializer_list<short> *simplex,
          Filtration_value *filtration)

{
  initializer_list<short> __ils;
  initializer_list<short> __ils_00;
  short *__first;
  short *__last;
  iterator __first_00;
  iterator __last_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
  pVar2;
  allocator<short> local_81;
  undefined1 local_80 [8];
  vector<short,_std::allocator<short>_> copy;
  vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>
  local_60;
  Filtration_value local_58;
  Filtration_value local_50;
  short *local_48;
  short *last;
  Filtration_value local_38;
  short *local_30;
  short *first;
  Filtration_value *filtration_local;
  initializer_list<short> *simplex_local;
  Simplex_tree<MiniSTOptions> *this_local;
  
  last = (short *)*filtration;
  local_38 = filtration[1];
  __ils._M_array = (iterator)filtration[0];
  __ils._M_len = (size_type)filtration[1];
  filtration_local = filtration;
  simplex_local = simplex;
  this_local = this;
  local_30 = std::begin<short>(__ils);
  local_58 = *filtration_local;
  local_50 = filtration_local[1];
  __ils_00._M_array = (iterator)filtration_local[0];
  __ils_00._M_len = (size_type)filtration_local[1];
  __last = std::end<short>(__ils_00);
  __first = local_30;
  local_48 = __last;
  if (local_30 == __last) {
    null_simplex();
    copy.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._7_1_ = 1;
    std::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
    ::
    pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool,_true>
              ((pair<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>_*,_true>,_bool>
                *)this,&local_60,
               (bool *)((long)&copy.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 7));
    uVar1 = extraout_RDX;
  }
  else {
    std::allocator<short>::allocator(&local_81);
    std::vector<short,std::allocator<short>>::vector<short_const*,void>
              ((vector<short,std::allocator<short>> *)local_80,__first,__last,&local_81);
    std::allocator<short>::~allocator(&local_81);
    __first_00 = std::begin<std::vector<short,std::allocator<short>>>
                           ((vector<short,_std::allocator<short>_> *)local_80);
    __last_00 = std::end<std::vector<short,std::allocator<short>>>
                          ((vector<short,_std::allocator<short>_> *)local_80);
    std::sort<__gnu_cxx::__normal_iterator<short*,std::vector<short,std::allocator<short>>>>
              ((__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               __first_00._M_current,
               (__normal_iterator<short_*,_std::vector<short,_std::allocator<short>_>_>)
               __last_00._M_current);
    insert_simplex_raw<std::vector<short,std::allocator<short>>>
              (this,(vector<short,_std::allocator<short>_> *)simplex,(Filtration_value *)local_80);
    std::vector<short,_std::allocator<short>_>::~vector
              ((vector<short,_std::allocator<short>_> *)local_80);
    uVar1 = extraout_RDX_00;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first.m_ptr =
       (pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MiniSTOptions>_>_>
        *)this;
  return pVar2;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex(const InputVertexRange & simplex,
                                                 const Filtration_value& filtration = Filtration_value()) {
    auto first = std::begin(simplex);
    auto last = std::end(simplex);

    if (first == last)
      return std::pair<Simplex_handle, bool>(null_simplex(), true);  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return insert_simplex_raw(copy, filtration);
  }